

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::ForAllEnumValues
          (RustGenerator *this,EnumDef *enum_def,function<void_()> *cb)

{
  function<void_(const_flatbuffers::EnumVal_&)> local_50;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:699:52)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:699:52)>
             ::_M_manager;
  local_30._M_unused._M_object = cb;
  std::function<void_(const_flatbuffers::EnumVal_&)>::function
            (&local_50,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_30);
  ForAllEnumValues1(this,enum_def,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return;
}

Assistant:

void ForAllEnumValues(const EnumDef &enum_def, std::function<void()> cb) {
    std::function<void(const EnumVal &)> wrapped = [&](const EnumVal &unused) {
      (void)unused;
      cb();
    };
    ForAllEnumValues1(enum_def, wrapped);
  }